

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O2

int __thiscall Fl_Browser_::displayed(Fl_Browser_ *this,void *item)

{
  int iVar1;
  void *pvVar2;
  int H;
  int W;
  int Y;
  int X;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined4 extraout_var;
  
  bbox(this,&local_24,&local_28,&local_2c,&local_30);
  local_30 = this->offset_ + local_30;
  pvVar2 = this->top_;
  while( true ) {
    if ((pvVar2 == item) || (local_30 < 1 || pvVar2 == (void *)0x0)) break;
    iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar2);
    local_30 = local_30 - iVar1;
    iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar2);
    pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
  }
  return (int)(local_30 >= 1 && pvVar2 != (void *)0x0);
}

Assistant:

int Fl_Browser_::displayed(void* item) const {
  int X, Y, W, H; bbox(X, Y, W, H);
  int yy = H+offset_;
  for (void* l = top_; l && yy > 0; l = item_next(l)) {
    if (l == item) return 1;
    yy -= item_height(l);
  }
  return 0;
}